

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void nop_1e(PDISASM pMyDisasm)

{
  int iVar1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).REGOPCODE =
           (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
      if ((pMyDisasm->Reserved_).REGOPCODE == 1) {
        (pMyDisasm->Prefix).RepPrefix = '\b';
        (pMyDisasm->Instruction).Category = 0x170000;
        iVar1 = Security(2,pMyDisasm);
        if (iVar1 != 0) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            if (((pMyDisasm->Reserved_).REX.state == '\x01') &&
               ((pMyDisasm->Reserved_).REX.W_ == '\x01')) {
              strcpy((pMyDisasm->Instruction).Mnemonic,"rdsspq");
            }
            else {
              strcpy((pMyDisasm->Instruction).Mnemonic,"rdsspd");
            }
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Reserved_).OperandSize = IVar2;
            decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Operand2).OpType = 0x20000;
            (pMyDisasm->Operand2).OpSize = 0x40;
            (pMyDisasm->Operand2).Registers.type = 0x20;
            (pMyDisasm->Operand2).Registers.special = 4;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 7) {
        (pMyDisasm->Prefix).RepPrefix = '\b';
        iVar1 = Security(2,pMyDisasm);
        if (iVar1 != 0) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          (pMyDisasm->Reserved_).RM_ = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) & 7;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            if ((pMyDisasm->Reserved_).RM_ == 2) {
              (pMyDisasm->Instruction).Category = 0x170000;
              strcpy((pMyDisasm->Instruction).Mnemonic,"endbr64");
              (pMyDisasm->Reserved_).EIP_ =
                   (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
            }
            else if ((pMyDisasm->Reserved_).RM_ == 3) {
              (pMyDisasm->Instruction).Category = 0x170000;
              strcpy((pMyDisasm->Instruction).Mnemonic,"endbr32");
              (pMyDisasm->Reserved_).EIP_ =
                   (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
            }
          }
          else {
            failDecode(pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  else {
    (pMyDisasm->Instruction).Category = 0x1000c;
    strcpy((pMyDisasm->Instruction).Mnemonic,"hint_nop");
    if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
    }
    else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x66;
    }
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ nop_1e(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  else if (GV.PrefRepe == 1) {
    /* ======= prefix f3 ========= */
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 1) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      pMyDisasm->Instruction.Category = CET_INSTRUCTION;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if ((GV.REX.state == InUsePrefix) && (GV.REX.W_ == 1)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspd");
        #endif
      }
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = 64;
      pMyDisasm->Operand2.Registers.type = SPECIAL_REG;
      pMyDisasm->Operand2.Registers.special = REG2; /* SSP reg */
    }
    else if (GV.REGOPCODE == 7) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if (GV.RM_ == 0x2) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr64");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
      else if (GV.RM_ == 0x3) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr32");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+MISCELLANEOUS_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "hint_nop");
    #endif
    if (GV.OperandSize == 64) {
      GV.MemDecoration = Arg2qword;
    }
    else if (GV.OperandSize == 32) {
      GV.MemDecoration = Arg2dword;
    }
    else {
      GV.MemDecoration = Arg2word;
    }
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ;
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
}